

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall ot::commissioner::CommissionerImpl::LoggingConfig(CommissionerImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string local_a8;
  pointer local_88;
  char *pcStack_80;
  size_t local_78;
  undefined8 local_70;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  code *local_60;
  string local_50;
  
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"config","");
  local_88 = (pointer)CONCAT44(local_88._4_4_,string_type);
  pcStack_80 = "Id = {}";
  local_78 = 7;
  local_70._0_4_ = 0;
  local_70._4_4_ = 1;
  local_60 = ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
  pcVar4 = "Id = {}";
  local_68 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_88;
  do {
    pcVar3 = pcVar4 + 1;
    if (*pcVar4 == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = pcVar4 + 2;
    }
    else if (*pcVar4 == '{') {
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_88);
    }
    pcVar4 = pcVar3;
  } while (pcVar3 != "");
  local_88 = (this->mConfig).mId._M_dataplus._M_p;
  pcStack_80 = (char *)(this->mConfig).mId._M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x7;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_88;
  ::fmt::v10::vformat_abi_cxx11_(&local_50,(v10 *)"Id = {}",fmt,args);
  Log(kInfo,&local_a8,&local_50);
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"config","");
  local_88 = (pointer)CONCAT44(local_88._4_4_,bool_type);
  pcStack_80 = "enable CCM = {}";
  local_78 = 0xf;
  local_70._0_4_ = 0;
  local_70._4_4_ = 1;
  local_60 = ::fmt::v10::detail::
             parse_format_specs<bool,fmt::v10::detail::compile_parse_context<char>>;
  pcVar4 = "enable CCM = {}";
  local_68 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_88;
  do {
    pcVar3 = pcVar4 + 1;
    if (*pcVar4 == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = pcVar4 + 2;
    }
    else if (*pcVar4 == '{') {
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,bool>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_88);
    }
    pcVar4 = pcVar3;
  } while (pcVar3 != "");
  local_88 = (pointer)(ulong)(this->mConfig).mEnableCcm;
  fmt_00.size_ = 7;
  fmt_00.data_ = (char *)0xf;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)&local_88;
  ::fmt::v10::vformat_abi_cxx11_(&local_50,(v10 *)"enable CCM = {}",fmt_00,args_00);
  Log(kInfo,&local_a8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"config","");
  local_88 = (pointer)CONCAT44(local_88._4_4_,string_type);
  pcStack_80 = "domain name = {}";
  local_78 = 0x10;
  local_70._0_4_ = 0;
  local_70._4_4_ = 1;
  local_60 = ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
  pcVar4 = "domain name = {}";
  local_68 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_88;
  do {
    pcVar3 = pcVar4 + 1;
    if (*pcVar4 == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = pcVar4 + 2;
    }
    else if (*pcVar4 == '{') {
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_88);
    }
    pcVar4 = pcVar3;
  } while (pcVar3 != "");
  local_88 = (this->mConfig).mDomainName._M_dataplus._M_p;
  pcStack_80 = (char *)(this->mConfig).mDomainName._M_string_length;
  fmt_01.size_ = 0xd;
  fmt_01.data_ = (char *)0x10;
  args_01.field_1.args_ = in_R9.args_;
  args_01.desc_ = (unsigned_long_long)&local_88;
  ::fmt::v10::vformat_abi_cxx11_(&local_50,(v10 *)"domain name = {}",fmt_01,args_01);
  Log(kInfo,&local_a8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"config","");
  local_88 = (pointer)CONCAT44(local_88._4_4_,uint_type);
  pcStack_80 = "keep alive interval = {}";
  local_78 = 0x18;
  local_70._0_4_ = 0;
  local_70._4_4_ = 1;
  local_60 = ::fmt::v10::detail::
             parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
  pcVar4 = "keep alive interval = {}";
  local_68 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_88;
  do {
    pcVar3 = pcVar4 + 1;
    if (*pcVar4 == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = pcVar4 + 2;
    }
    else if (*pcVar4 == '{') {
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_88);
    }
    pcVar4 = pcVar3;
  } while (pcVar3 != "");
  local_88 = (pointer)(ulong)(this->mConfig).mKeepAliveInterval;
  fmt_02.size_ = 2;
  fmt_02.data_ = (char *)0x18;
  args_02.field_1.args_ = in_R9.args_;
  args_02.desc_ = (unsigned_long_long)&local_88;
  ::fmt::v10::vformat_abi_cxx11_(&local_50,(v10 *)"keep alive interval = {}",fmt_02,args_02);
  Log(kInfo,&local_a8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"config","");
  local_88 = (pointer)CONCAT44(local_88._4_4_,bool_type);
  pcStack_80 = "enable DTLS debug logging = {}";
  local_78 = 0x1e;
  local_70._0_4_ = 0;
  local_70._4_4_ = 1;
  local_60 = ::fmt::v10::detail::
             parse_format_specs<bool,fmt::v10::detail::compile_parse_context<char>>;
  pcVar4 = "enable DTLS debug logging = {}";
  local_68 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_88;
  do {
    pcVar3 = pcVar4 + 1;
    if (*pcVar4 == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = pcVar4 + 2;
    }
    else if (*pcVar4 == '{') {
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,bool>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_88);
    }
    pcVar4 = pcVar3;
  } while (pcVar3 != "");
  local_88 = (pointer)(ulong)(this->mConfig).mEnableDtlsDebugLogging;
  fmt_03.size_ = 7;
  fmt_03.data_ = (char *)0x1e;
  args_03.field_1.args_ = in_R9.args_;
  args_03.desc_ = (unsigned_long_long)&local_88;
  ::fmt::v10::vformat_abi_cxx11_(&local_50,(v10 *)"enable DTLS debug logging = {}",fmt_03,args_03);
  Log(kInfo,&local_a8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"config","");
  local_88 = (pointer)CONCAT44(local_88._4_4_,uint_type);
  pcStack_80 = "maximum connection number = {}";
  local_78 = 0x1e;
  local_70._0_4_ = 0;
  local_70._4_4_ = 1;
  local_60 = ::fmt::v10::detail::
             parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
  pcVar4 = "maximum connection number = {}";
  local_68 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_88;
  do {
    pcVar3 = pcVar4 + 1;
    if (*pcVar4 == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = pcVar4 + 2;
    }
    else if (*pcVar4 == '{') {
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_88);
    }
    pcVar4 = pcVar3;
    if (pcVar3 == "") {
      local_88 = (pointer)(ulong)(this->mConfig).mMaxConnectionNum;
      fmt_04.size_ = 2;
      fmt_04.data_ = (char *)0x1e;
      args_04.field_1.args_ = in_R9.args_;
      args_04.desc_ = (unsigned_long_long)&local_88;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_50,(v10 *)"maximum connection number = {}",fmt_04,args_04);
      Log(kInfo,&local_a8,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      return;
    }
  } while( true );
}

Assistant:

void CommissionerImpl::LoggingConfig()
{
    LOG_INFO(LOG_REGION_CONFIG, "Id = {}", mConfig.mId);
    LOG_INFO(LOG_REGION_CONFIG, "enable CCM = {}", mConfig.mEnableCcm);
    LOG_INFO(LOG_REGION_CONFIG, "domain name = {}", mConfig.mDomainName);
    LOG_INFO(LOG_REGION_CONFIG, "keep alive interval = {}", mConfig.mKeepAliveInterval);
    LOG_INFO(LOG_REGION_CONFIG, "enable DTLS debug logging = {}", mConfig.mEnableDtlsDebugLogging);
    LOG_INFO(LOG_REGION_CONFIG, "maximum connection number = {}", mConfig.mMaxConnectionNum);

    // Do not logging credentials
}